

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O0

int bzip2_filter_close(archive_read_filter *self)

{
  bz_stream *strm;
  int iVar1;
  int local_1c;
  int ret;
  private_data *state;
  archive_read_filter *self_local;
  
  local_1c = 0;
  strm = (bz_stream *)self->data;
  if ((char)strm[1].total_in_hi32 != '\0') {
    iVar1 = BZ2_bzDecompressEnd(strm);
    if (iVar1 != 0) {
      archive_set_error(&self->archive->archive,-1,"Failed to clean up decompressor");
      local_1c = -0x1e;
    }
    *(undefined1 *)&strm[1].total_in_hi32 = 0;
  }
  free(strm[1].next_in);
  free(strm);
  return local_1c;
}

Assistant:

static int
bzip2_filter_close(struct archive_read_filter *self)
{
	struct private_data *state;
	int ret = ARCHIVE_OK;

	state = (struct private_data *)self->data;

	if (state->valid) {
		switch (BZ2_bzDecompressEnd(&state->stream)) {
		case BZ_OK:
			break;
		default:
			archive_set_error(&self->archive->archive,
					  ARCHIVE_ERRNO_MISC,
					  "Failed to clean up decompressor");
			ret = ARCHIVE_FATAL;
		}
		state->valid = 0;
	}

	free(state->out_block);
	free(state);
	return (ret);
}